

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O3

void tokelse(tokcxdef *ctx,char *p,int len)

{
  long lVar1;
  char cVar2;
  
  lVar1 = (long)ctx->tokcxifcnt;
  if ((lVar1 == 0) || ((byte)ctx->tokcxif[lVar1 + -1] - 3 < 2)) {
    errlogf(ctx->tokcxerr,"TADS",0x71);
    return;
  }
  cVar2 = '\x04';
  if (ctx->tokcxif[lVar1 + -1] != 1) {
    cVar2 = '\x03';
  }
  ctx->tokcxif[lVar1 + -1] = cVar2;
  if (0 < (long)ctx->tokcxifcnt) {
    lVar1 = 0;
    do {
      ctx->tokcxifcur = (int)ctx->tokcxif[lVar1];
      if (ctx->tokcxif[lVar1] == '\x02') {
        return;
      }
      if (ctx->tokcxif[lVar1] == '\x04') {
        return;
      }
      lVar1 = lVar1 + 1;
    } while (ctx->tokcxifcnt != lVar1);
  }
  return;
}

Assistant:

static void tokelse(tokcxdef *ctx, char *p, int len)
{
    int cnt;
    
    /* if we're not expecting #else, it's an error */
    cnt = ctx->tokcxifcnt;
    if (cnt == 0 || ctx->tokcxif[cnt-1] == TOKIF_ELSE_YES
        || ctx->tokcxif[cnt-1] == TOKIF_ELSE_NO)
    {
        errlog(ctx->tokcxerr, ERR_BADPELSE);
        return;
    }

    /* switch to the appropriate #else state (opposite the #if state) */
    if (ctx->tokcxif[cnt-1] == TOKIF_IF_YES)
        ctx->tokcxif[cnt-1] = TOKIF_ELSE_NO;
    else
        ctx->tokcxif[cnt-1] = TOKIF_ELSE_YES;

    /* update the current status */
    tok_update_if_stat(ctx);
}